

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void editor_free(t_editor *x,_glist *y)

{
  _glist *y_local;
  t_editor *x_local;
  
  glist_noselect(y);
  guiconnect_notarget(x->e_guiconnect,1000.0);
  binbuf_free(x->e_connectbuf);
  binbuf_free(x->e_deleted);
  if (x->e_clock != (_clock *)0x0) {
    clock_free(x->e_clock);
  }
  freebytes(x,0xa0);
  return;
}

Assistant:

static void editor_free(t_editor *x, t_glist *y)
{
    glist_noselect(y);
    guiconnect_notarget(x->e_guiconnect, 1000);
    binbuf_free(x->e_connectbuf);
    binbuf_free(x->e_deleted);
    if (x->e_clock)
        clock_free(x->e_clock);
    freebytes((void *)x, sizeof(*x));
}